

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbordiagnostic.cpp
# Opt level: O1

QString * __thiscall
QCborValue::toDiagnosticNotation
          (QString *__return_storage_ptr__,QCborValue *this,DiagnosticNotationOptions opts)

{
  storage_type *in_RCX;
  char *pcVar1;
  long in_FS_OFFSET;
  QByteArrayView ba;
  undefined1 local_98 [80];
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_98._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = (QArrayData *)0x0;
  local_98._8_8_ = (int *)0x0;
  local_98._16_8_ = 0;
  pcVar1 = "\n";
  if (((uint)opts.super_QFlagsStorageHelper<QCborValue::DiagnosticNotationOption,_4>.
             super_QFlagsStorage<QCborValue::DiagnosticNotationOption>.i & 1) == 0) {
    pcVar1 = "";
  }
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)pcVar1;
  QString::fromLatin1(&local_48,
                      (QString *)
                      (ulong)((uint)opts.
                                    super_QFlagsStorageHelper<QCborValue::DiagnosticNotationOption,_4>
                                    .super_QFlagsStorage<QCborValue::DiagnosticNotationOption>.i & 1
                             ),ba);
  local_98._24_8_ = CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_);
  local_98._32_8_ = local_48.d.ptr;
  local_98._40_8_ = local_48.d.size;
  local_98._48_8_ = (QArrayData *)0x0;
  local_98._56_8_ = (char16_t *)0x0;
  local_98._64_8_ = 0;
  local_98._76_4_ = 0;
  local_98._72_4_ =
       opts.super_QFlagsStorageHelper<QCborValue::DiagnosticNotationOption,_4>.
       super_QFlagsStorage<QCborValue::DiagnosticNotationOption>.i;
  local_48.d.d._0_4_ = 0x17;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)local_98,local_98._16_8_,(int *)&local_48);
  QList<int>::end((QList<int> *)local_98);
  anon_unknown.dwarf_a2d105::DiagnosticNotation::appendValue
            ((DiagnosticNotation *)local_98,(QCborValue *)this);
  (__return_storage_ptr__->d).d = (Data *)local_98._48_8_;
  (__return_storage_ptr__->d).ptr = (char16_t *)local_98._56_8_;
  (__return_storage_ptr__->d).size = local_98._64_8_;
  if ((QArrayData *)local_98._48_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._48_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._48_8_)->_q_value).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (((QBasicAtomicInt *)local_98._48_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._48_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._48_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._48_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_98._24_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._24_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._24_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98._0_8_,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QCborValue::toDiagnosticNotation(DiagnosticNotationOptions opts) const
{
    return DiagnosticNotation::create(*this, opts);
}